

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_test.c
# Opt level: O2

void test_cv_producer_consumer0(testing t)

{
  closure_t_producer_cv_n_0 a0;
  closure *cl;
  int in_ECX;
  undefined4 extraout_EDX;
  int start;
  undefined4 extraout_var;
  closure_t_producer_cv_n_3 in_R8D;
  
  a0 = (closure_t_producer_cv_n_0)cv_queue_new(1);
  cl = closure_producer_cv_n
                 ((_func_void_closure_t_producer_cv_n_0_closure_t_producer_cv_n_1_closure_t_producer_cv_n_2_closure_t_producer_cv_n_3
                   *)t,a0,(closure_t_producer_cv_n_1)CONCAT44(extraout_var,extraout_EDX),in_ECX,
                  in_R8D);
  closure_fork(cl);
  consumer_cv_n(t,(cv_queue *)a0,start,in_ECX);
  free(a0);
  return;
}

Assistant:

static void test_cv_producer_consumer0 (testing t) {
	cv_queue *q = cv_queue_new (1);
	closure_fork (closure_producer_cv_n (&producer_cv_n, t, q, 0, CV_PRODUCER_CONSUMER_N));
	consumer_cv_n (t, q, 0, CV_PRODUCER_CONSUMER_N);
	free (q);
}